

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::ProjectionLight::SampleLe
          (LightLeSample *__return_storage_ptr__,ProjectionLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  uintptr_t uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  uint uVar10;
  Float *pFVar11;
  int c;
  int c_00;
  Tuple2<pbrt::Point2,_int> p;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar18 [48];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  float fVar19;
  Float FVar20;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float n2;
  SampledSpectrum SVar39;
  float local_128;
  Float pdf;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined4 local_f0;
  undefined8 local_ec;
  float local_e4;
  int vb;
  undefined1 auStack_dc [12];
  Interval<float> local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Float va;
  float fStack_74;
  Interval<float> IStack_70;
  Interval<float> local_68 [4];
  uintptr_t local_48;
  SampledWavelengths *local_40;
  LightLeSample *local_38;
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar27 [56];
  undefined1 auVar33 [56];
  
  auVar18 = in_ZmmResult._16_48_;
  auVar22._0_8_ = PiecewiseConstant2D::Sample(&this->distrib,u1,&pdf);
  auVar22._8_56_ = extraout_var;
  local_98 = auVar22._0_16_;
  if ((pdf != 0.0) || (NAN(pdf))) {
    auVar31 = vmovshdup_avx(local_98);
    fVar28 = auVar31._0_4_;
    auVar36 = ZEXT816(0) << 0x40;
    uVar3 = (this->super_LightBase).mediumInterface.outside.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    p = (Tuple2<pbrt::Point2,_int>)&(this->super_LightBase).renderFromLight;
    auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[0][1])),local_98,
                              ZEXT416((uint)(this->LightFromScreen).m.m[0][0]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[2][1])),local_98,
                             ZEXT416((uint)(this->LightFromScreen).m.m[2][0]));
    auVar31 = vfmadd231ss_fma(auVar31,ZEXT816(0) << 0x40,
                              ZEXT416((uint)(this->LightFromScreen).m.m[0][2]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar36,ZEXT416((uint)(this->LightFromScreen).m.m[2][2]));
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[1][1])),local_98,
                              ZEXT416((uint)(this->LightFromScreen).m.m[1][0]));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[3][1])),local_98,
                              ZEXT416((uint)(this->LightFromScreen).m.m[3][0]));
    fVar28 = auVar31._0_4_ + (this->LightFromScreen).m.m[0][3];
    fVar5 = auVar7._0_4_ + (this->LightFromScreen).m.m[2][3];
    auVar31 = vfmadd231ss_fma(auVar21,auVar36,ZEXT416((uint)(this->LightFromScreen).m.m[1][2]));
    auVar7 = vfmadd231ss_fma(auVar13,auVar36,ZEXT416((uint)(this->LightFromScreen).m.m[3][2]));
    fVar12 = auVar7._0_4_ + (this->LightFromScreen).m.m[3][3];
    fVar6 = auVar31._0_4_ + (this->LightFromScreen).m.m[1][3];
    local_f8 = 0;
    local_f0 = 0;
    bVar4 = fVar12 == 1.0;
    fVar35 = fVar28 / fVar12;
    fVar19 = fVar5 / fVar12;
    fVar12 = (float)((uint)bVar4 * (int)fVar6 + (uint)!bVar4 * (int)(fVar6 / fVar12));
    auVar15._16_48_ = auVar18;
    auVar15._0_16_ = ZEXT416((uint)fVar35);
    auVar14._4_60_ = auVar15._4_60_;
    auVar14._0_4_ = (float)((uint)bVar4 * (int)fVar28 + (uint)!bVar4 * (int)fVar35);
    auVar17._16_48_ = auVar18;
    auVar17._0_16_ = ZEXT416((uint)fVar19);
    auVar16._4_60_ = auVar17._4_60_;
    auVar16._0_4_ = (float)((uint)bVar4 * (int)fVar5 + (uint)!bVar4 * (int)fVar19);
    auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar14._0_16_,auVar14._0_16_);
    auVar31 = vfmadd231ss_fma(auVar31,auVar16._0_16_,auVar16._0_16_);
    auVar31 = vsqrtss_avx(auVar31,auVar31);
    fVar28 = auVar31._0_4_;
    local_e4 = auVar16._0_4_ / fVar28;
    auVar31 = vinsertps_avx(ZEXT416((uint)(auVar14._0_4_ / fVar28)),ZEXT416((uint)(fVar12 / fVar28))
                            ,0x10);
    local_108._0_4_ = local_e4;
    uVar1 = vmovlps_avx(auVar31);
    _vb = vmovlhps_avx(ZEXT816(0),ZEXT816(0));
    local_ec._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    local_d0 = (Interval<float>)vmovlps_avx(ZEXT816(0));
    local_ec._0_4_ = (uint)uVar1;
    uVar10 = (uint)local_ec;
    local_88._0_4_ = local_ec._4_4_;
    local_ec = uVar1;
    Transform::operator()((Point3fi *)&va,(Transform *)p,(Point3fi *)&vb);
    auVar31 = vfmadd231ss_fma(ZEXT416((uint)((float)local_88._0_4_ *
                                            (this->super_LightBase).renderFromLight.m.m[1][1])),
                              ZEXT416(uVar10),
                              ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_88._0_4_ *
                                           (this->super_LightBase).renderFromLight.m.m[0][1])),
                             ZEXT416(uVar10),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)((float)local_88._0_4_ *
                                            (this->super_LightBase).renderFromLight.m.m[2][1])),
                              ZEXT416(uVar10),
                              ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
    auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)local_108._0_4_),
                              ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_108._0_4_),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
    local_88 = vfmadd231ss_fma(auVar21,ZEXT416((uint)local_108._0_4_),
                               ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
    fVar28 = auVar31._0_4_;
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),auVar7,auVar7);
    auVar21 = vfmadd231ss_fma(auVar21,local_88,local_88);
    if (auVar21._0_4_ <= 0.0) {
      auVar21._8_8_ = 0;
      auVar21._0_4_ = local_68[0].low;
      auVar21._4_4_ = local_68[0].high;
    }
    else {
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx(auVar31,auVar29);
      auVar36 = vandps_avx(auVar7,auVar29);
      auVar29 = vandps_avx(local_88,auVar29);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar36);
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT816(0) << 0x40,auVar29);
      fVar12 = auVar13._0_4_ / auVar21._0_4_;
      fVar5 = auVar7._0_4_ * fVar12;
      local_b8 = ZEXT416((uint)(local_88._0_4_ * fVar12));
      i.high = fVar5;
      i.low = fVar5;
      local_c8 = ZEXT416((uint)(fVar28 * fVar12));
      local_a8 = auVar31;
      auVar23._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&va,i);
      auVar23._8_56_ = extraout_var_00;
      uVar1 = vmovlps_avx(auVar23._0_16_);
      va = (Float)uVar1;
      fStack_74 = (float)((ulong)uVar1 >> 0x20);
      i_00.high = (float)local_c8._0_4_;
      i_00.low = (float)local_c8._0_4_;
      auVar24._0_8_ = Interval<float>::operator+<float>(&IStack_70,i_00);
      auVar24._8_56_ = extraout_var_01;
      uVar1 = vmovlps_avx(auVar24._0_16_);
      IStack_70.low = (float)uVar1;
      IStack_70.high = (float)((ulong)uVar1 >> 0x20);
      i_01.high = (float)local_b8._0_4_;
      i_01.low = (float)local_b8._0_4_;
      auVar25._0_8_ = Interval<float>::operator+<float>(local_68,i_01);
      auVar25._8_56_ = extraout_var_02;
      auVar21 = auVar25._0_16_;
      auVar31 = local_a8;
    }
    auVar29 = _vb;
    auVar36._4_4_ = fStack_74;
    auVar36._0_4_ = va;
    auVar36._8_4_ = IStack_70.low;
    auVar36._12_4_ = IStack_70.high;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = auStack_dc;
    _vb = auVar9 << 0x20;
    auVar13 = vinsertps_avx(auVar36,ZEXT416((uint)IStack_70.high),0x10);
    auVar30._0_4_ = fStack_74 + auVar13._0_4_;
    auVar30._4_4_ = IStack_70.low + auVar13._4_4_;
    auVar30._8_4_ = auVar13._8_4_ + 0.0;
    auVar30._12_4_ = auVar13._12_4_ + 0.0;
    auVar13._8_4_ = 0x3f000000;
    auVar13._0_8_ = 0x3f0000003f000000;
    auVar13._12_4_ = 0x3f000000;
    auVar13 = vmulps_avx512vl(auVar30,auVar13);
    va = (Float)local_108._0_4_;
    if ((float)local_108._0_4_ <= 0.0) {
      LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x173,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [9])"cosTheta",
                 (char (*) [2])0x2925374,(char (*) [9])"cosTheta",(float *)&va,
                 (char (*) [2])0x2925374,&vb);
    }
    TVar2 = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar37._8_8_ = 0;
    auVar37._0_4_ = TVar2.x;
    auVar37._4_4_ = TVar2.y;
    fVar28 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.x;
    fVar5 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.y;
    fVar12 = fVar28 - TVar2.x;
    auVar38 = vsubps_avx(local_98,auVar37);
    auVar36 = vmovshdup_avx(auVar37);
    if (TVar2.x < fVar28) {
      auVar8 = auVar38._4_12_;
      auVar38._0_4_ = auVar38._0_4_ / fVar12;
      auVar38._4_12_ = auVar8;
    }
    auVar21 = vhaddps_avx(auVar21,auVar21);
    fVar6 = fVar5 - auVar36._0_4_;
    fVar28 = (float)local_108._0_4_ * (float)local_108._0_4_ * (float)local_108._0_4_;
    if (auVar36._0_4_ < fVar5) {
      auVar36 = vmovshdup_avx(auVar38);
      auVar34._0_4_ = auVar36._0_4_ / fVar6;
      auVar34._4_12_ = auVar36._4_12_;
      auVar38 = vinsertps_avx(auVar38,auVar34,0x10);
    }
    fVar5 = this->A;
    local_a8 = vinsertps_avx(auVar7,auVar31,0x10);
    c_00 = 0;
    auStack_dc._8_4_ = auVar29._12_4_;
    _vb = (RGB)ZEXT812(0);
    local_c8._0_4_ = pdf;
    local_b8._0_4_ = auVar21._0_4_ * 0.5;
    auVar31 = vmovshdup_avx(auVar38);
    local_98 = auVar13;
    local_48 = uVar3;
    local_40 = lambda;
    local_38 = __return_storage_ptr__;
    do {
      local_108 = auVar38;
      local_128 = auVar31._0_4_;
      p = (Tuple2<pbrt::Point2,_int>)
          (CONCAT44(p.y,(int)(local_108._0_4_ *
                             (float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x)) |
          (ulong)(uint)(int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y *
                            local_128) << 0x20);
      FVar20 = Image::GetChannel(&this->image,(Point2i)p,c_00,(WrapMode2D)0x200000002);
      pFVar11 = (Float *)&vb;
      if ((c_00 != 0) && (pFVar11 = (Float *)auStack_dc, c_00 != 1)) {
        pFVar11 = (Float *)(auStack_dc + 4);
      }
      c_00 = c_00 + 1;
      *pFVar11 = FVar20;
      auVar38 = local_108;
    } while (c_00 != 3);
    fVar19 = this->scale;
    auVar31._4_4_ = fVar19;
    auVar31._0_4_ = fVar19;
    auVar31._8_4_ = fVar19;
    auVar31._12_4_ = fVar19;
    auVar33 = ZEXT856(auVar31._8_8_);
    auVar27 = ZEXT856(0);
    local_108._0_4_ = (fVar12 * fVar6 * (float)local_c8._0_4_) / (fVar28 * fVar5);
    RGBSpectrum::RGBSpectrum((RGBSpectrum *)&va,this->imageColorSpace,(RGB *)&vb);
    SVar39 = RGBSpectrum::Sample((RGBSpectrum *)&va,local_40);
    auVar32._0_8_ = SVar39.values.values._8_8_;
    auVar32._8_56_ = auVar33;
    auVar26._0_8_ = SVar39.values.values._0_8_;
    auVar26._8_56_ = auVar27;
    auVar31 = vmovlhps_avx(auVar26._0_16_,auVar32._0_16_);
    (local_38->L).values.values[0] = auVar31._0_4_ * fVar19;
    (local_38->L).values.values[1] = auVar31._4_4_ * fVar19;
    (local_38->L).values.values[2] = auVar31._8_4_ * fVar19;
    (local_38->L).values.values[3] = auVar31._12_4_ * fVar19;
    uVar1 = vmovlps_avx(local_98);
    (local_38->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (local_38->ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (local_38->ray).o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_b8._0_4_;
    uVar1 = vmovlps_avx(local_a8);
    (local_38->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    (local_38->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (local_38->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_88._0_4_;
    (local_38->ray).time = time;
    (local_38->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_48;
    (local_38->intr).set = false;
    local_38->pdfPos = 1.0;
    local_38->pdfDir = (Float)local_108._0_4_;
    __return_storage_ptr__ = local_38;
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
    *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
    __return_storage_ptr__->pdfPos = 0.0;
    __return_storage_ptr__->pdfDir = 0.0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    (__return_storage_ptr__->L).values.values[0] = 0.0;
    (__return_storage_ptr__->L).values.values[1] = 0.0;
    (__return_storage_ptr__->L).values.values[2] = 0.0;
    (__return_storage_ptr__->L).values.values[3] = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
    (__return_storage_ptr__->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
    (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

LightLeSample ProjectionLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                        SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f ps = distrib.Sample(u1, &pdf);
    if (pdf == 0)
        return {};

    Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));

    Ray ray = renderFromLight(
        Ray(Point3f(0, 0, 0), Normalize(w), time, mediumInterface.outside));
    Float cosTheta = CosTheta(Normalize(w));
    CHECK_GT(cosTheta, 0);
    Float pdfDir = pdf * screenBounds.Area() / (A * Pow<3>(cosTheta));

    Point2f p = Point2f(screenBounds.Offset(ps));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(p, c);

    SampledSpectrum L = scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

    return LightLeSample(L, ray, 1, pdfDir);
}